

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_proto.c
# Opt level: O0

pkt_status_t send_mm_packet(mm_proto_t *proto,uint8_t *payload,size_t len,uint8_t flags)

{
  char *pcVar1;
  ulong uVar2;
  int local_14c;
  undefined1 auStack_148 [4];
  int i;
  timespec tim;
  int retries;
  pkt_status_t status;
  mm_packet_t pkt;
  uint8_t flags_local;
  size_t len_local;
  uint8_t *payload_local;
  mm_proto_t *proto_local;
  
  tim.tv_nsec._4_4_ = 0;
  pkt.payload[0xfb] = flags;
  unique0x10000468 = len;
  for (tim.tv_nsec._0_4_ = 0; (int)(uint)tim.tv_nsec < 5; tim.tv_nsec._0_4_ = (uint)tim.tv_nsec + 1)
  {
    if (proto->connected == 0) {
      return 2;
    }
    if (3 < proto->debuglevel) {
      if (payload == (uint8_t *)0x0) {
        pcVar1 = "NACK";
        if ((pkt.payload[0xfb] & 8) != 0) {
          pcVar1 = "ACK";
        }
        printf("T<--M Sending %s: rx_seq=%d\n",pcVar1,(ulong)proto->rx_seq);
      }
      else {
        printf("T<--M Sending packet: Terminal: %s, tx_seq=%d\n",proto->terminal_id,
               (ulong)proto->tx_seq);
      }
    }
    if (proto->use_modem != '\0') {
      _auStack_148 = 0;
      tim.tv_sec = (ulong)proto->rx_packet_gap * 10000000;
      nanosleep((timespec *)auStack_148,(timespec *)0x0);
    }
    memset((void *)((long)&retries + 1),0,0x106);
    retries._1_1_ = 2;
    if (payload == (uint8_t *)0x0) {
      pkt.payload[0xf8] = '\0';
      retries._2_1_ = pkt.payload[0xfb] | proto->rx_seq & 3;
    }
    else {
      retries._2_1_ = proto->tx_seq & 3;
      pkt.payload[0xf8] = (char)stack0xffffffffffffffd8 + '\x05';
      for (local_14c = 0; local_14c < 5; local_14c = local_14c + 1) {
        *(char *)((long)&status + (long)local_14c) = proto->terminal_id[local_14c << 1] * '\x10';
        *(byte *)((long)&status + (long)local_14c) =
             *(byte *)((long)&status + (long)local_14c) |
             proto->terminal_id[local_14c * 2 + 1] - 0x30U;
      }
      if (stack0xffffffffffffffd8 != 0) {
        memcpy(&pkt,payload,stack0xffffffffffffffd8);
      }
    }
    if ((pkt.payload[0xfb] & 4) != 0) {
      retries._2_1_ = retries._2_1_ | 4;
    }
    retries._3_1_ = pkt.payload[0xf8] + 5;
    pkt.payload._245_2_ = crc16(0,(uint8_t *)((long)&retries + 1),3);
    pkt.payload._245_2_ = crc16(pkt.payload._245_2_,(uint8_t *)&status,(ulong)pkt.payload[0xf8]);
    if ((inject_comm_error == 1) &&
       (((proto->error_inject_type == '\x01' && (pkt.payload[0xf8] != '\0')) ||
        ((proto->error_inject_type == '\x02' && (pkt.payload[0xf8] == '\0')))))) {
      pcVar1 = error_inject_type_to_str(proto->error_inject_type);
      printf("Injecting %s (Correct CRC=0x%02x).\n",pcVar1,(ulong)(ushort)pkt.payload._245_2_);
      inject_comm_error = 0;
      pkt.payload._245_2_ = pkt.payload._245_2_ ^ 0xffff;
    }
    pkt.payload[0xf7] = '\x03';
    pkt.payload[0xf9] = pkt.payload[0xf5];
    pkt.payload[0xfa] = pkt.payload[0xf6];
    uVar2 = (ulong)pkt.payload[0xf8];
    *(undefined2 *)((long)&status + uVar2) = pkt.payload._245_2_;
    *(uint8_t *)((long)&status + uVar2 + 2) = pkt.payload[0xf7];
    mm_add_pcap_rec(proto->pcapstream,3,(mm_packet_t *)((long)&retries + 1),0,0);
    if (proto->send_udp != '\0') {
      mm_udp_send_pkt(3,(mm_packet_t *)((long)&retries + 1));
    }
    if (proto->debuglevel != '\0') {
      print_mm_packet(3,(mm_packet_t *)((long)&retries + 1));
    }
    if (3 < proto->debuglevel) {
      printf("\nRaw Packet transmitted: ");
      dump_hex((uint8_t *)((long)&retries + 1),(ulong)retries._3_1_ + 1);
    }
    write_serial(proto->serial_context,(void *)((long)&retries + 1),(ulong)retries._3_1_ + 1);
    drain_serial(proto->serial_context);
    if ((payload == (uint8_t *)0x0) ||
       (tim.tv_nsec._4_4_ = wait_for_mm_ack(proto), tim.tv_nsec._4_4_ == 0)) break;
    printf("%s: Received NACK, retrying %d.\n","send_mm_packet",(ulong)(uint)tim.tv_nsec);
  }
  if ((uint)tim.tv_nsec == 5) {
    printf("%s: Error: Gave up after %d retries.\n","send_mm_packet",5);
    tim.tv_nsec._4_4_ = tim.tv_nsec._4_4_ | 0x200;
  }
  if (payload == (uint8_t *)0x0) {
    proto->rx_seq = proto->rx_seq + '\x01';
  }
  else {
    proto->tx_seq = proto->tx_seq + '\x01';
  }
  return tim.tv_nsec._4_4_;
}

Assistant:

static pkt_status_t send_mm_packet(mm_proto_t* proto, uint8_t* payload, size_t len, uint8_t flags) {
    mm_packet_t pkt;
    pkt_status_t status = PKT_SUCCESS;
    int retries;

    for (retries = 0; retries < PKT_MAX_RETRIES; retries++) {
        /* Bail out if not connected. */
        if (!proto->connected) {
            return PKT_ERROR_DISCONNECT;
        }

        if (proto->debuglevel > 3) {
            if (payload != NULL) {
                printf("T<--M Sending packet: Terminal: %s, tx_seq=%d\n", proto->terminal_id, proto->tx_seq);
            }
            else {
                printf("T<--M Sending %s: rx_seq=%d\n", (flags & FLAG_ACK) ? "ACK" : "NACK", proto->rx_seq);
            }
        }

        /* Insert Tx packet delay when using a modem, in 10ms increments. */
        if (proto->use_modem) {
#ifdef _WIN32
            Sleep(proto->rx_packet_gap * 10);
#else  /* ifdef _WIN32 */
            struct timespec tim;
            tim.tv_sec = 0;
            tim.tv_nsec = proto->rx_packet_gap * 10000000L;
            nanosleep(&tim, NULL);
#endif /* _WIN32 */
        }

        memset(&pkt, 0, sizeof(pkt));
        pkt.hdr.start = START_BYTE;

        if (payload != NULL) {
            /* Flags for regular TX packet use tx_seq. */
            pkt.hdr.flags = (proto->tx_seq & FLAG_SEQUENCE);
            pkt.payload_len = (uint8_t)len + PKT_TABLE_ID_OFFSET; /* add room for the phone number. */

            for (int i = 0; i < PKT_TABLE_ID_OFFSET; i++) {
                pkt.payload[i] = (proto->terminal_id[i * 2] - '0') << 4;
                pkt.payload[i] |= (proto->terminal_id[i * 2 + 1] - '0');
            }

            if (len > 0) {
                memcpy(&pkt.payload[PKT_TABLE_ID_OFFSET], payload, len);
            }
        } else {
            pkt.payload_len = 0;

            /* If payload is NULL, send an ACK packet instead, using rx_seq. */
            pkt.hdr.flags = flags | (proto->rx_seq & FLAG_SEQUENCE);
        }

        if (flags & FLAG_RETRY) {
            pkt.hdr.flags |= FLAG_RETRY;
        }

        pkt.hdr.pktlen = pkt.payload_len + 5;
        pkt.trailer.crc = crc16(0, &pkt.hdr.start, 3);
        pkt.trailer.crc = crc16(pkt.trailer.crc, pkt.payload, (size_t)(pkt.payload_len));
        pkt.trailer.crc = LE16(pkt.trailer.crc);
        if (inject_comm_error == 1) {
            if (((proto->error_inject_type == ERROR_INJECT_CRC_DLOG_TX) && (pkt.payload_len != 0)) ||
                ((proto->error_inject_type == ERROR_INJECT_CRC_ACK_TX) && (pkt.payload_len == 0))) {
                printf("Injecting %s (Correct CRC=0x%02x).\n",
                    error_inject_type_to_str(proto->error_inject_type),
                    pkt.trailer.crc);
                inject_comm_error = 0;
                pkt.trailer.crc = ~pkt.trailer.crc;
            }
        }
        pkt.trailer.end = STOP_BYTE;
        pkt.calculated_crc = pkt.trailer.crc;

        /* Copy the CRC and STOP_BYTE to be adjacent to the filled portion of the payload */
        memcpy(&(pkt.payload[pkt.payload_len]), &pkt.trailer.crc, 3);

        mm_add_pcap_rec(proto->pcapstream, TX, &pkt, 0, 0);
        if (proto->send_udp) {
            mm_udp_send_pkt(TX, &pkt);
        }

        if (proto->debuglevel > 0) {
            print_mm_packet(TX, &pkt);
        }

        if (proto->debuglevel > 3) {
            printf("\nRaw Packet transmitted: ");
            dump_hex(&pkt.hdr.start, (size_t)pkt.hdr.pktlen + 1);
        }

        write_serial(proto->serial_context, &pkt, (size_t)pkt.hdr.pktlen + 1);
        drain_serial(proto->serial_context);

        /* Don't wait for ACK if sending an ACK. */
        if (payload == NULL) {
            break;
        }

        status = wait_for_mm_ack(proto);
        if (status == PKT_SUCCESS) {
            break;
        }

        printf("%s: Received NACK, retrying %d.\n", __func__, retries);
    }

    if (retries == PKT_MAX_RETRIES) {
        printf("%s: Error: Gave up after %d retries.\n", __func__, retries);
        status |= PKT_ERROR_FAILURE;
    }

    if (payload != NULL) {
        proto->tx_seq++;
    } else {
        proto->rx_seq++;
    }
    return status;
}